

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

_Bool upb_strtable_insert(upb_strtable *t,char *k,size_t len,upb_value v,upb_Arena *a)

{
  _Bool _Var1;
  uint32_t hash;
  char *tabkey;
  ulong size;
  lookupkey_t key;
  
  if (((t->t).count != (ulong)(t->t).max_count) ||
     (_Var1 = upb_strtable_resize(t,(ulong)(t->t).size_lg2 + 1,a), _Var1)) {
    size = len + 0xc & 0xfffffffffffffff8;
    tabkey = a->ptr_dont_copy_me__upb_internal_use_only;
    if ((ulong)((long)a->end_dont_copy_me__upb_internal_use_only - (long)tabkey) < size) {
      tabkey = (char *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(a,size);
    }
    else {
      if ((char *)((ulong)(tabkey + 7) & 0xfffffffffffffff8) != tabkey) {
        __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mem/internal/arena.h"
                      ,0x3f,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
      }
      a->ptr_dont_copy_me__upb_internal_use_only = tabkey + size;
    }
    if (tabkey == (char *)0x0) {
      tabkey = (char *)0x0;
    }
    else {
      *(int *)tabkey = (int)len;
      if (len != 0) {
        memcpy(tabkey + 4,k,len);
      }
      tabkey[len + 4] = '\0';
    }
    if (tabkey != (char *)0x0) {
      hash = _upb_Hash(k,len,0);
      key.str.len = len;
      key.str.str = k;
      insert(&t->t,key,(upb_tabkey)tabkey,v,hash,strhash,streql);
      return true;
    }
  }
  return false;
}

Assistant:

bool upb_strtable_insert(upb_strtable* t, const char* k, size_t len,
                         upb_value v, upb_Arena* a) {
  lookupkey_t key;
  upb_tabkey tabkey;
  uint32_t hash;

  if (isfull(&t->t)) {
    /* Need to resize.  New table of double the size, add old elements to it. */
    if (!upb_strtable_resize(t, t->t.size_lg2 + 1, a)) {
      return false;
    }
  }

  key = strkey2(k, len);
  tabkey = strcopy(key, a);
  if (tabkey == 0) return false;

  hash = _upb_Hash_NoSeed(key.str.str, key.str.len);
  insert(&t->t, key, tabkey, v, hash, &strhash, &streql);
  return true;
}